

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5StructureAddLevel(int *pRc,Fts5Structure **ppStruct)

{
  Fts5StructureLevel *pFVar1;
  Fts5Structure *pFVar2;
  long lVar3;
  
  if (*pRc != 0) {
    return;
  }
  lVar3 = (long)(*ppStruct)->nLevel;
  pFVar2 = (Fts5Structure *)sqlite3_realloc64(*ppStruct,lVar3 * 0x10 + 0x38);
  if (pFVar2 == (Fts5Structure *)0x0) {
    *pRc = 7;
  }
  else {
    pFVar1 = pFVar2->aLevel + lVar3;
    pFVar1->nMerge = 0;
    pFVar1->nSeg = 0;
    pFVar1->aSeg = (Fts5StructureSegment *)0x0;
    pFVar2->nLevel = pFVar2->nLevel + 1;
    *ppStruct = pFVar2;
  }
  return;
}

Assistant:

static void fts5StructureAddLevel(int *pRc, Fts5Structure **ppStruct){
  if( *pRc==SQLITE_OK ){
    Fts5Structure *pStruct = *ppStruct;
    int nLevel = pStruct->nLevel;
    sqlite3_int64 nByte = (
        sizeof(Fts5Structure) +                  /* Main structure */
        sizeof(Fts5StructureLevel) * (nLevel+1)  /* aLevel[] array */
    );

    pStruct = sqlite3_realloc64(pStruct, nByte);
    if( pStruct ){
      memset(&pStruct->aLevel[nLevel], 0, sizeof(Fts5StructureLevel));
      pStruct->nLevel++;
      *ppStruct = pStruct;
    }else{
      *pRc = SQLITE_NOMEM;
    }
  }
}